

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMainClass *stm)

{
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
  *this_00;
  pointer pCVar2;
  mapped_type *pmVar3;
  pointer pCVar4;
  shared_ptr<ClassInfo> local_90 [2];
  CError local_70;
  TypeInfo local_40;
  CMainClass *local_18;
  CMainClass *stm_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CMainClass *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: mainclass\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->id);
  if (bVar1) {
    this_00 = &std::__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->table)->classes;
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&local_18->id);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
             ::operator[](this_00,&pCVar2->name);
    std::shared_ptr<ClassInfo>::operator=(&this->currentClass,pmVar3);
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&local_18->id);
    (**(pCVar2->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
    pCVar4 = std::unique_ptr<CMainMethod,_std::default_delete<CMainMethod>_>::operator->
                       (&local_18->mainMethod);
    (**(pCVar4->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
    TypeInfo::TypeInfo(&local_40,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
  }
  else {
    CError::CError(&local_70,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(local_18->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_70);
    CError::~CError(&local_70);
  }
  std::shared_ptr<ClassInfo>::shared_ptr(local_90,(nullptr_t)0x0);
  std::shared_ptr<ClassInfo>::operator=(&this->currentClass,local_90);
  std::shared_ptr<ClassInfo>::~shared_ptr(local_90);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMainClass &stm )
{
	std::cout << "typechecker: mainclass\n";
    if( stm.id ) {
        currentClass = table->classes[stm.id->name];
        stm.id->Accept( *this );
        stm.mainMethod->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentClass = nullptr;
}